

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Response * __thiscall Filer_::handle(Response *__return_storage_ptr__,Filer_ *this,Request *request)

{
  Request *request_local;
  Filer_ *this_local;
  Response *response;
  
  Neyn::Response::Response(__return_storage_ptr__);
  Neyn::Filer::operator()((Request *)this,(Response *)request);
  return __return_storage_ptr__;
}

Assistant:

Response handle(const Request &request)
    {
        Response response;
        Filer::operator()(const_cast<Request &>(request), response);
        return response;
    }